

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O3

uint __thiscall
GeneralHash<1,unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (GeneralHash<1,unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar8 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 (((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                  (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                 (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                       .super__Deque_impl_data._M_finish._M_first));
  uVar6 = 0;
  if (puVar8 != puVar2) {
    uVar9 = (long)puVar2 -
            (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    uVar6 = 0;
    uVar11 = 0;
    uVar10 = 1;
    do {
      uVar5 = *(uint *)(this + 0xc);
      if ((*(uint *)(this + 0x410) & ~(uVar6 * 2)) != 0) {
        uVar5 = 0;
      }
      if ((long)uVar9 < 0) {
        uVar11 = (long)uVar9 >> 9;
LAB_0010a44b:
        pbVar7 = ppuVar3[uVar11] + uVar9 + uVar11 * -0x200;
      }
      else {
        if (0x1ff < uVar9) {
          uVar11 = uVar9 >> 9;
          goto LAB_0010a44b;
        }
        pbVar7 = puVar2 + uVar11;
      }
      uVar6 = uVar5 ^ *(uint *)(this + (ulong)*pbVar7 * 4 + 0x10) ^ uVar6 * 2;
      uVar9 = uVar9 + 1;
      bVar4 = uVar10 < (ulong)((long)puVar8 - (long)puVar2);
      uVar11 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar4);
  }
  return uVar6;
}

Assistant:

hashvaluetype hash(container &c) const {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift(answer, 1);
      answer ^= hasher.hashvalues[c[k]];
    }
    return answer;
  }